

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O2

int64_t secp256k1_testrandi64(uint64_t min,uint64_t max)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint64_t x;
  
  x = max - min;
  if (x != 0) {
    iVar1 = secp256k1_clz64_var(x);
    do {
      uVar2 = secp256k1_testrand32();
      uVar3 = secp256k1_testrand32();
      uVar4 = CONCAT44(uVar2,uVar3) >> ((byte)iVar1 & 0x3f);
    } while (x < uVar4);
    max = uVar4 + min;
  }
  return max;
}

Assistant:

SECP256K1_INLINE static int64_t secp256k1_testrandi64(uint64_t min, uint64_t max) {
    uint64_t range;
    uint64_t r;
    uint64_t clz;
    VERIFY_CHECK(max >= min);
    if (max == min) {
        return min;
    }
    range = max - min;
    clz = secp256k1_clz64_var(range);
    do {
        r = ((uint64_t)secp256k1_testrand32() << 32) | secp256k1_testrand32();
        r >>= clz;
    } while (r > range);
    return min + (int64_t)r;
}